

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.hpp
# Opt level: O2

bool jsoncons::operator<(basic_bigint<std::allocator<unsigned_char>_> *x,int64_t y)

{
  int iVar1;
  basic_bigint<std::allocator<unsigned_char>_> bStack_38;
  
  bStack_38.field_0._0_1_ = (byte)((ulong)y >> 0x3e) & 2;
  bStack_38.field_0.common_stor_.length_ = (size_type)(y != 0);
  bStack_38.field_0.short_stor_.values_[0] = -y;
  if (0 < y) {
    bStack_38.field_0.short_stor_.values_[0] = y;
  }
  bStack_38.field_0.short_stor_.values_[1] = 0;
  iVar1 = basic_bigint<std::allocator<unsigned_char>_>::compare(x,&bStack_38);
  basic_bigint<std::allocator<unsigned_char>_>::destroy(&bStack_38);
  return SUB41((uint)iVar1 >> 0x1f,0);
}

Assistant:

short_storage(T n, 
                      typename std::enable_if<std::is_integral<T>::value &&
                                              sizeof(T) <= sizeof(int64_t) &&
                                              std::is_signed<T>::value>::type* = 0)
            : is_dynamic_(false), 
              is_negative_(n < 0),
              length_(n == 0 ? 0 : 1)
        {
            values_[0] = n < 0 ? (uint64_t(0)-static_cast<uint64_t>(n)) : static_cast<uint64_t>(n);
            values_[1] = 0;
        }